

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncLogging.cpp
# Opt level: O2

void __thiscall AsyncLogging::threadFunc(AsyncLogging *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  const_iterator __last;
  pointer psVar2;
  element_type *logline;
  uint __line;
  FixedBuffer<4000000> *__p;
  char *__assertion;
  shared_ptr<FixedBuffer<4000000>_> *buffer;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  MutexLockGuard lock;
  undefined1 local_a8 [8];
  LogFile output;
  undefined1 local_58 [8];
  BufferPtr newBuffer;
  BufferVector buffersToWrite;
  
  if (this->running_ == false) {
    __assertion = "running_ == true";
    __line = 0x23;
  }
  else {
    CountDownLatch::countDown(&this->latch_);
    LogFile::LogFile((LogFile *)local_a8,&this->basename_,0x400);
    __p = (FixedBuffer<4000000> *)operator_new(0x3d0908);
    __p->cur_ = (char *)__p;
    std::__shared_ptr<FixedBuffer<4000000>,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<FixedBuffer<4000000>,void>
              ((__shared_ptr<FixedBuffer<4000000>,(__gnu_cxx::_Lock_policy)2> *)local_58,__p);
    memset((void *)local_58,0,4000000);
    newBuffer.super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    buffersToWrite.
    super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    buffersToWrite.
    super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
    ::reserve((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
               *)&newBuffer.super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,0x10);
    output.file_._M_t.super___uniq_ptr_impl<AppendFile,_std::default_delete<AppendFile>_>._M_t.
    super__Tuple_impl<0UL,_AppendFile_*,_std::default_delete<AppendFile>_>.
    super__Head_base<0UL,_AppendFile_*,_false>._M_head_impl =
         (__uniq_ptr_data<AppendFile,_std::default_delete<AppendFile>,_true,_true>)&this->buffers_;
    while( true ) {
      if (this->running_ != true) {
        LogFile::flush((LogFile *)local_a8);
        std::
        vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
        ::~vector((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                   *)&newBuffer.super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&newBuffer);
        LogFile::~LogFile((LogFile *)local_a8);
        return;
      }
      if ((local_58 == (undefined1  [8])0x0) ||
         (*(int *)((long)local_58 + 4000000) != local_58._0_4_)) break;
      if (newBuffer.super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    buffersToWrite.
                    super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
        __assertion = "buffersToWrite.empty()";
        __line = 0x2d;
        goto LAB_00113811;
      }
      pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
      if ((this->buffers_).
          super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (this->buffers_).
          super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        Condition::waitForSeconds(&this->cond_,this->flushInterval_);
      }
      std::
      vector<std::shared_ptr<FixedBuffer<4000000>>,std::allocator<std::shared_ptr<FixedBuffer<4000000>>>>
      ::emplace_back<std::shared_ptr<FixedBuffer<4000000>>>
                ((vector<std::shared_ptr<FixedBuffer<4000000>>,std::allocator<std::shared_ptr<FixedBuffer<4000000>>>>
                  *)output.file_._M_t.
                    super___uniq_ptr_impl<AppendFile,_std::default_delete<AppendFile>_>._M_t.
                    super__Tuple_impl<0UL,_AppendFile_*,_std::default_delete<AppendFile>_>.
                    super__Head_base<0UL,_AppendFile_*,_false>._M_head_impl,&this->currentBuffer_);
      std::__shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->currentBuffer_).
                  super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2> *)local_58);
      p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (this->buffers_).
               super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __last._M_current =
           (this->buffers_).
           super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      psVar2 = (this->buffers_).
               super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (this->buffers_).
      super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)newBuffer.super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      (this->buffers_).
      super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           buffersToWrite.
           super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (this->buffers_).
      super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           buffersToWrite.
           super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      newBuffer.super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = p_Var1;
      pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
      if (newBuffer.super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__last._M_current) {
        __assertion = "!buffersToWrite.empty()";
        __line = 0x38;
        goto LAB_00113811;
      }
      _Var3._M_pi = newBuffer.super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      if (400 < (ulong)((long)__last._M_current -
                       (long)newBuffer.
                             super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi)) {
        std::
        vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
        ::erase((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                 *)&newBuffer.super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,
                (shared_ptr<FixedBuffer<4000000>_> *)
                (newBuffer.super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi + 2),__last);
        _Var3 = newBuffer.super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
      }
      for (; _Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__last._M_current;
          _Var3._M_pi = _Var3._M_pi + 1) {
        logline = ((__shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2> *)
                  &(_Var3._M_pi)->_vptr__Sp_counted_base)->_M_ptr;
        LogFile::append((LogFile *)local_a8,logline->data_,*(int *)&logline->cur_ - (int)logline);
      }
      if (0x10 < (ulong)((long)__last._M_current -
                        (long)newBuffer.
                              super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)) {
        std::
        vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
        ::resize((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                  *)&newBuffer.super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount,1);
      }
      buffersToWrite.
      super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = __last._M_current;
      if (local_58 == (undefined1  [8])0x0) {
        if (newBuffer.super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__last._M_current)
        {
          __assertion = "!buffersToWrite.empty()";
          __line = 0x47;
          goto LAB_00113811;
        }
        std::__shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2> *)local_58,
                   &__last._M_current[-1].
                    super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>);
        buffersToWrite.
        super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = __last._M_current + -1;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&__last._M_current[-1].
                    super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  );
        *(undefined1 (*) [8])((long)local_58 + 4000000) = local_58;
      }
      std::
      vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
      ::clear((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
               *)&newBuffer.super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      LogFile::flush((LogFile *)local_a8);
      buffersToWrite.
      super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = psVar2;
    }
    __assertion = "newBuffer && newBuffer->length() == 0";
    __line = 0x2c;
  }
LAB_00113811:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/base/AsyncLogging.cpp"
                ,__line,"void AsyncLogging::threadFunc()");
}

Assistant:

void AsyncLogging::threadFunc() {
    assert(running_ == true);
    latch_.countDown();
    LogFile output(basename_);
    BufferPtr newBuffer(new Buffer);
    newBuffer->bzero();
    BufferVector buffersToWrite;
    buffersToWrite.reserve(16);

    while (running_) {
        assert(newBuffer && newBuffer->length() == 0);
        assert(buffersToWrite.empty());
        {
            MutexLockGuard lock(mutex_);
            if(buffers_.empty()) {
                cond_.waitForSeconds(flushInterval_);
            }
            buffers_.push_back(std::move(currentBuffer_));
            currentBuffer_ = std::move(newBuffer);
            buffersToWrite.swap(buffers_);
        }
        
        assert(!buffersToWrite.empty());

        if (buffersToWrite.size() > 25) {
            buffersToWrite.erase(buffersToWrite.begin() + 2, buffersToWrite.end());
        }

        for (const auto& buffer : buffersToWrite) {
            output.append(buffer->data(), buffer->length());
        }

        if (buffersToWrite.size() > 1) {
            buffersToWrite.resize(1); 
        }

        if (!newBuffer) {
            assert(!buffersToWrite.empty());
            newBuffer = std::move(buffersToWrite.back());
            buffersToWrite.pop_back();
            newBuffer->reset();
        }

        buffersToWrite.clear();
        output.flush();
    }

    output.flush();
}